

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_LABEL(Context *ctx)

{
  RegisterList *item;
  RegisterList *pRVar1;
  Buffer *pBVar2;
  uint uVar3;
  Context *in_RCX;
  uint uVar4;
  char labelstr [64];
  char acStack_58 [72];
  
  if (ctx->profile_supports_nv2 == 0) {
    return;
  }
  pRVar1 = (ctx->used_registers).next;
  if (pRVar1 != (RegisterList *)0x0) {
    uVar3 = ctx->source_args[0].regnum | 0x120000;
    in_RCX = (Context *)(ulong)uVar3;
    do {
      uVar4 = pRVar1->regtype << 0x10 | pRVar1->regnum;
      if (uVar3 == uVar4) goto LAB_00117b38;
    } while ((uVar4 <= uVar3) && (pRVar1 = pRVar1->next, pRVar1 != (RegisterList *)0x0));
  }
  pBVar2 = ctx->ignore;
  if (pBVar2 == (Buffer *)0x0) {
    in_RCX = ctx;
    pBVar2 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
    ctx->ignore = pBVar2;
    if (pBVar2 == (Buffer *)0x0) goto LAB_00117b38;
  }
  ctx->output = pBVar2;
LAB_00117b38:
  get_ARB1_srcarg_varname(ctx,0,acStack_58,(size_t)in_RCX);
  output_line(ctx,"%s:",acStack_58);
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(ENDLOOP)

static void emit_ARB1_LABEL(Context *ctx)
{
    if (!support_nv2(ctx))  // no branching in stock ARB1.
        return;  // don't fail()...maybe we never use it, but do fail in CALL.

    const int label = ctx->source_args[0].regnum;
    RegisterList *reg = reglist_find(&ctx->used_registers, REG_TYPE_LABEL, label);

    // MSDN specs say CALL* has to come before the LABEL, so we know if we
    //  can ditch the entire function here as unused.
    if (reg == NULL)
        set_output(ctx, &ctx->ignore);  // Func not used. Parse, but don't output.

    // !!! FIXME: it would be nice if we could determine if a function is
    // !!! FIXME:  only called once and, if so, forcibly inline it.

    //const char *uses_loopreg = ((reg) && (reg->misc == 1)) ? "int aL" : "";
    char labelstr[64];
    get_ARB1_srcarg_varname(ctx, 0, labelstr, sizeof (labelstr));
    output_line(ctx, "%s:", labelstr);
}